

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-sve.c
# Opt level: O3

void do_index(DisasContext_conflict1 *s,int esz,int rd,TCGv_i64 start,TCGv_i64 incr)

{
  uint32_t val;
  uintptr_t o_1;
  TCGv_i32 pTVar1;
  TCGTemp *pTVar2;
  TCGTemp *ts;
  undefined4 in_register_00000034;
  TCGContext_conflict1 *tcg_ctx;
  TCGv_i64 in_R9;
  uintptr_t o_2;
  uintptr_t o_3;
  uintptr_t o;
  TCGv_i64 ret;
  TCGTemp *local_58;
  TCGv_i64 local_50;
  TCGv_i64 local_48;
  TCGv_i32 local_40;
  
  tcg_ctx = (TCGContext_conflict1 *)CONCAT44(in_register_00000034,esz);
  val = simd_desc_aarch64((uint32_t)s,(uint32_t)s,0);
  pTVar1 = tcg_const_i32_aarch64(tcg_ctx,val);
  pTVar2 = tcg_temp_new_internal_aarch64(tcg_ctx,TCG_TYPE_I64,false);
  ret = (TCGv_i64)((long)pTVar2 - (long)tcg_ctx);
  tcg_gen_addi_i64_aarch64
            (tcg_ctx,ret,(TCGv_i64)tcg_ctx->cpu_env,(long)((int)start * 0x100 + 0xc10));
  if (rd == 3) {
    local_58 = (TCGTemp *)((long)tcg_ctx + (long)ret);
    local_50 = incr + (long)tcg_ctx;
    local_48 = in_R9 + (long)tcg_ctx;
    local_40 = pTVar1 + (long)&tcg_ctx->pool_cur;
    tcg_gen_callN_aarch64(tcg_ctx,helper_sve_index_d_aarch64,(TCGTemp *)0x0,4,&local_58);
  }
  else {
    pTVar2 = tcg_temp_new_internal_aarch64(tcg_ctx,TCG_TYPE_I32,false);
    ts = tcg_temp_new_internal_aarch64(tcg_ctx,TCG_TYPE_I32,false);
    tcg_gen_extrl_i64_i32_aarch64(tcg_ctx,(TCGv_i32)((long)pTVar2 - (long)tcg_ctx),incr);
    tcg_gen_extrl_i64_i32_aarch64(tcg_ctx,(TCGv_i32)((long)ts - (long)tcg_ctx),in_R9);
    (*do_index::fns[rd])
              (tcg_ctx,(TCGv_ptr)ret,(TCGv_i32)((long)pTVar2 - (long)tcg_ctx),
               (TCGv_i32)((long)ts - (long)tcg_ctx),pTVar1);
    tcg_temp_free_internal_aarch64(tcg_ctx,pTVar2);
    tcg_temp_free_internal_aarch64(tcg_ctx,ts);
  }
  tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(ret + (long)tcg_ctx));
  tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(pTVar1 + (long)tcg_ctx));
  return;
}

Assistant:

static void do_index(DisasContext *s, int esz, int rd,
                     TCGv_i64 start, TCGv_i64 incr)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    unsigned vsz = vec_full_reg_size(s);
    TCGv_i32 desc = tcg_const_i32(tcg_ctx, simd_desc(vsz, vsz, 0));
    TCGv_ptr t_zd = tcg_temp_new_ptr(tcg_ctx);

    tcg_gen_addi_ptr(tcg_ctx, t_zd, tcg_ctx->cpu_env, vec_full_reg_offset(s, rd));
    if (esz == 3) {
        gen_helper_sve_index_d(tcg_ctx, t_zd, start, incr, desc);
    } else {
        typedef void index_fn(TCGContext *, TCGv_ptr, TCGv_i32, TCGv_i32, TCGv_i32);
        static index_fn * const fns[3] = {
            gen_helper_sve_index_b,
            gen_helper_sve_index_h,
            gen_helper_sve_index_s,
        };
        TCGv_i32 s32 = tcg_temp_new_i32(tcg_ctx);
        TCGv_i32 i32 = tcg_temp_new_i32(tcg_ctx);

        tcg_gen_extrl_i64_i32(tcg_ctx, s32, start);
        tcg_gen_extrl_i64_i32(tcg_ctx, i32, incr);
        fns[esz](tcg_ctx, t_zd, s32, i32, desc);

        tcg_temp_free_i32(tcg_ctx, s32);
        tcg_temp_free_i32(tcg_ctx, i32);
    }
    tcg_temp_free_ptr(tcg_ctx, t_zd);
    tcg_temp_free_i32(tcg_ctx, desc);
}